

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

string * __thiscall
cppcms::http::response::get_header(string *__return_storage_ptr__,response *this,string *name)

{
  string *psVar1;
  
  psVar1 = cppcms::impl::response_headers::get_header(&((this->d).ptr_)->headers,name);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string response::get_header(std::string const &name)
{
	return d->headers.get_header(name);
}